

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

optional<slang::TimeScaleValue> slang::parseValue(string_view str,size_t *lengthConsumed)

{
  _Storage<int,_true> _Var1;
  _Optional_payload_base<int> _Var2;
  _Optional_payload_base<int> _Var3;
  byte bVar4;
  slang *this;
  int in_R8D;
  string_view str_00;
  string_view timeSuffix;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t idx;
  size_t unitConsumed;
  string_view str_local;
  
  str_00._M_len = str._M_str;
  this = (slang *)str._M_len;
  str_00._M_str = (char *)&idx;
  str_local._M_len = (size_t)this;
  str_local._M_str = str_00._M_len;
  _Var2 = (_Optional_payload_base<int>)strToInt(this,str_00,(size_t *)0xa,in_R8D);
  _Var3 = _Var2;
  if (((ulong)_Var2 >> 0x20 & 1) != 0) {
    for (; idx < this; idx = idx + 1) {
      if (str_00._M_len[idx] != ' ') {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&str_local,idx,0xffffffffffffffff);
        timeSuffix._M_str = (char *)&unitConsumed;
        timeSuffix._M_len = (size_t)bVar5._M_str;
        _Var3._M_payload._0_2_ = suffixToTimeUnit((slang *)bVar5._M_len,timeSuffix,&unitConsumed);
        _Var3._2_6_ = 0;
        if (((ushort)_Var3._M_payload._0_2_ >> 8 & 1) != 0) {
          *lengthConsumed = unitConsumed + idx;
          _Var1._0_3_ = TimeScaleValue::fromLiteral
                                  ((double)_Var2._M_payload._M_value,_Var3._M_payload._0_1_);
          _Var1._M_value._3_1_ = 0;
          bVar4 = _Var1._2_1_;
          goto LAB_0040b29c;
        }
        break;
      }
    }
  }
  _Var1 = _Var3._M_payload;
  bVar4 = 0;
LAB_0040b29c:
  return (_Optional_base<slang::TimeScaleValue,_true,_true>)
         ((uint3)_Var1._M_value & 0xffff | (uint3)bVar4 << 0x10);
}

Assistant:

static std::optional<TimeScaleValue> parseValue(std::string_view str, size_t& lengthConsumed) {
    size_t idx;
    auto i = strToInt(str, &idx);
    if (!i)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size())
        return {};

    size_t unitConsumed;
    auto unit = suffixToTimeUnit(str.substr(idx), unitConsumed);
    if (!unit)
        return {};

    lengthConsumed = idx + unitConsumed;
    return TimeScaleValue::fromLiteral(double(*i), *unit);
}